

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiceEffectsObserver.cpp
# Opt level: O3

void __thiscall DiceEffectsObserver::update(DiceEffectsObserver *this)

{
  Player *pPVar1;
  size_t __n;
  pointer ppPVar2;
  pointer ppPVar3;
  int iVar4;
  Dice *pDVar5;
  Player *this_00;
  mapped_type *pmVar6;
  string *psVar7;
  ostream *poVar8;
  string *psVar9;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  unresolvedHand;
  key_type local_64;
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  local_60;
  
  pDVar5 = (Dice *)__dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Dice::typeinfo,0);
  Dice::diceHistoricalValues(pDVar5);
  pDVar5 = (Dice *)__dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Dice::typeinfo,0);
  iVar4 = Dice::getPlayerNumber(pDVar5);
  this_00 = Game::getPlayerByID(iVar4);
  pDVar5 = Player::getDice(this_00);
  std::
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::_Rb_tree(&local_60,&(pDVar5->DiceValues)._M_t);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\n****************************************************************************",0x4d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-------------------- DICE EFFECT OBSERVER ----------------------------------",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "****************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "*************  The potential effect of your roll is : **********************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  local_64 = Energy;
  pmVar6 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                         *)&local_60,&local_64);
  if (0 < *pmVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player: ",8);
    psVar7 = Player::getPlayerName_abi_cxx11_(this_00);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," added ",7);
    local_64 = Energy;
    pmVar6 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                           *)&local_60,&local_64);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,*pmVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," energy points",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  local_64 = Attack;
  pmVar6 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                         *)&local_60,&local_64);
  if (0 < *pmVar6) {
    iVar4 = Player::getZone(this_00);
    if ((iVar4 < 1) ||
       (iVar4 = Player::getZone(this_00),
       ppPVar3 = Game::players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,
       ppPVar2 = Game::players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_start, 6 < iVar4)) {
      iVar4 = Player::getZone(this_00);
      ppPVar3 = Game::players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppPVar2 = Game::players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (6 < iVar4) {
        for (; ppPVar2 != ppPVar3; ppPVar2 = ppPVar2 + 1) {
          pPVar1 = *ppPVar2;
          psVar7 = Player::getPlayerName_abi_cxx11_(pPVar1);
          psVar9 = Player::getPlayerName_abi_cxx11_(this_00);
          __n = psVar7->_M_string_length;
          if ((((__n != psVar9->_M_string_length) ||
               ((__n != 0 &&
                (iVar4 = bcmp((psVar7->_M_dataplus)._M_p,(psVar9->_M_dataplus)._M_p,__n), iVar4 != 0
                )))) && (iVar4 = Player::getZone(pPVar1), 0 < iVar4)) &&
             (iVar4 = Player::getZone(pPVar1), iVar4 < 7)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player: ",8);
            psVar7 = Player::getPlayerName_abi_cxx11_(pPVar1);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(psVar7->_M_dataplus)._M_p,
                                psVar7->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," removed ",9);
            local_64 = Attack;
            pmVar6 = std::
                     map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                     ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                                   *)&local_60,&local_64);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,*pmVar6);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," life points since he is inside manhattan",0x29);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
        }
      }
    }
    else {
      for (; ppPVar2 != ppPVar3; ppPVar2 = ppPVar2 + 1) {
        pPVar1 = *ppPVar2;
        iVar4 = Player::getZone(pPVar1);
        if (6 < iVar4) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player: ",8);
          psVar7 = Player::getPlayerName_abi_cxx11_(pPVar1);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(psVar7->_M_dataplus)._M_p,
                              psVar7->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," removed ",9);
          local_64 = Attack;
          pmVar6 = std::
                   map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                   ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                                 *)&local_60,&local_64);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,*pmVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," life points since he is outside manhattan",0x2a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
        }
      }
    }
  }
  local_64 = Destruction;
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                *)&local_60,&local_64);
  local_64 = Heal;
  pmVar6 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                         *)&local_60,&local_64);
  if ((0 < *pmVar6) && (iVar4 = Player::getZone(this_00), 6 < iVar4)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player: ",8);
    psVar7 = Player::getPlayerName_abi_cxx11_(this_00);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," can add ",9);
    local_64 = Heal;
    pmVar6 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                           *)&local_60,&local_64);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,*pmVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," health points",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  local_64 = Celebrity;
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                *)&local_60,&local_64);
  local_64 = Ouch;
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                *)&local_60,&local_64);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "****************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void DiceEffectsObserver::update() {

    dynamic_cast<Dice*>(concreteSubject)->diceHistoricalValues();

    auto currentPlayer = Game::getPlayerByID(dynamic_cast<Dice*>(concreteSubject)->getPlayerNumber());

    map<Dice::DiceOptions, int> unresolvedHand = currentPlayer->getDice()->DiceValues;

    cout << "\n****************************************************************************" << endl;

    cout << "-------------------- DICE EFFECT OBSERVER ----------------------------------" << endl;

    cout << "****************************************************************************" << endl;
    cout << "*************  The potential effect of your roll is : **********************" << endl;

    if(unresolvedHand[Dice::Energy] > 0){ // Energy option
        cout << "Player: "<< currentPlayer->getPlayerName() << " added " << unresolvedHand[Dice::Energy] << " energy points" << endl;
    }

    if(unresolvedHand[Dice::Attack] > 0){ // Attack option
        if(currentPlayer->getZone()>0 && currentPlayer->getZone() < 7) { // In Manhattan
            for(auto tempPlayer : Game::players){
                if(tempPlayer->getZone() > 6){ // All players outside manhattan get -1 health
                    cout << "Player: "<< tempPlayer->getPlayerName() << " removed " << unresolvedHand[Dice::Attack] << " life points since he is outside manhattan" << endl;
                }
            }
        }
        else if(currentPlayer->getZone() > 6){ // Outside manhattan
            for(auto tempPlayer : Game::players){
                if(tempPlayer->getPlayerName() == currentPlayer->getPlayerName()){
                    continue;
                }
                if(tempPlayer->getZone() > 0 && tempPlayer->getZone() < 7){ // All players inside manhattan get -1 health
                    cout << "Player: "<< tempPlayer->getPlayerName() << " removed " << unresolvedHand[Dice::Attack] << " life points since he is inside manhattan" << endl;
                }
            }
        }
    }

    if(unresolvedHand[Dice::Destruction] > 0) { // Destruction option

    }

    if(unresolvedHand[Dice::Heal] > 0 && currentPlayer->getZone() >6) { // Heal Option
        cout << "Player: "<< currentPlayer->getPlayerName() << " can add " << unresolvedHand[Dice::Heal] << " health points" << endl;

    }

    if(unresolvedHand[Dice::Celebrity] > 0) { // Celebrity Option

    }

    if(unresolvedHand[Dice::Ouch] > 0) { // Ouch Option

    }
    cout << "****************************************************************************" << endl;

}